

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::Utf8_ByteOrderMark(void)

{
  int iVar1;
  allocator local_29;
  string local_28;
  
  if (Utf8_ByteOrderMark()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Utf8_ByteOrderMark()::e);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_1079ebd,&local_29);
      RegEx::RegEx(&Utf8_ByteOrderMark::e,&local_28,REGEX_SEQ);
      std::__cxx11::string::~string((string *)&local_28);
      __cxa_atexit(RegEx::~RegEx,&Utf8_ByteOrderMark::e,&__dso_handle);
      __cxa_guard_release(&Utf8_ByteOrderMark()::e);
    }
  }
  return &Utf8_ByteOrderMark::e;
}

Assistant:

inline const RegEx& Utf8_ByteOrderMark() {
  static const RegEx e = RegEx("\xEF\xBB\xBF");
  return e;
}